

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  ImRect *pIVar1;
  float fVar2;
  ImVec2 IVar3;
  ImGuiWindow *window;
  ImGuiContext *pIVar4;
  ImGuiID id;
  int iVar5;
  ImGuiColumns *pIVar6;
  ImGuiColumnData *pIVar7;
  ImGuiColumnData *pIVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ImGuiContext *g;
  ulong uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  
  pIVar4 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1ca9,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((window->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    __assert_fail("window->DC.CurrentColumns == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1caa,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  id = GetColumnsID(str_id,columns_count);
  pIVar6 = FindOrCreateColumns(window,id);
  if (pIVar6->ID != id) {
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1caf,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  pIVar6->Current = 0;
  pIVar6->Count = columns_count;
  pIVar6->Flags = flags;
  (window->DC).CurrentColumns = pIVar6;
  pIVar6->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar6->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar3 = (window->ClipRect).Max;
  (pIVar6->HostClipRect).Min = (window->ClipRect).Min;
  (pIVar6->HostClipRect).Max = IVar3;
  IVar3 = (window->WorkRect).Max;
  (pIVar6->HostWorkRect).Min = (window->WorkRect).Min;
  (pIVar6->HostWorkRect).Max = IVar3;
  fVar2 = (pIVar4->Style).ItemSpacing.x;
  fVar15 = (window->WindowPadding).x;
  fVar17 = fVar2 - fVar15;
  fVar15 = fVar15 * 0.5;
  uVar14 = -(uint)(window->WindowBorderSize <= fVar15);
  fVar16 = (window->WorkRect).Max.x;
  fVar17 = (float)(-(uint)(0.0 <= fVar17) & (uint)fVar17);
  fVar20 = (fVar2 + fVar16) - fVar17;
  fVar16 = (float)(int)(float)(~uVar14 & (uint)window->WindowBorderSize | (uint)fVar15 & uVar14) +
           fVar16;
  if (fVar16 <= fVar20) {
    fVar20 = fVar16;
  }
  fVar17 = ((window->DC).Indent.x - fVar2) + fVar17;
  pIVar6->OffMinX = fVar17;
  fVar20 = fVar20 - (window->Pos).x;
  fVar17 = fVar17 + 1.0;
  uVar14 = -(uint)(fVar17 <= fVar20);
  pIVar6->OffMaxX = (float)(~uVar14 & (uint)fVar17 | (uint)fVar20 & uVar14);
  fVar15 = (window->DC).CursorPos.y;
  pIVar6->LineMaxY = fVar15;
  pIVar6->LineMinY = fVar15;
  uVar14 = (pIVar6->Columns).Size;
  uVar9 = columns_count + 1;
  if (uVar14 == uVar9 || uVar14 == 0) {
    pIVar6->IsFirstFrame = uVar14 == 0;
    if (uVar14 != 0) goto LAB_002f0c43;
    iVar12 = (pIVar6->Columns).Capacity;
  }
  else {
    iVar12 = (pIVar6->Columns).Capacity;
    if (iVar12 < 0) {
      iVar12 = 0;
      pIVar7 = (ImGuiColumnData *)MemAlloc(0);
      pIVar8 = (pIVar6->Columns).Data;
      if (pIVar8 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar7,pIVar8,(long)(pIVar6->Columns).Size * 0x1c);
        MemFree((pIVar6->Columns).Data);
      }
      (pIVar6->Columns).Data = pIVar7;
      (pIVar6->Columns).Capacity = 0;
    }
    (pIVar6->Columns).Size = 0;
    pIVar6->IsFirstFrame = true;
  }
  if (iVar12 <= columns_count) {
    pIVar7 = (ImGuiColumnData *)MemAlloc((ulong)uVar9 * 0x1c);
    pIVar8 = (pIVar6->Columns).Data;
    if (pIVar8 != (ImGuiColumnData *)0x0) {
      memcpy(pIVar7,pIVar8,(long)(pIVar6->Columns).Size * 0x1c);
      MemFree((pIVar6->Columns).Data);
    }
    (pIVar6->Columns).Data = pIVar7;
    (pIVar6->Columns).Capacity = uVar9;
  }
  iVar12 = (pIVar6->Columns).Size;
  uVar14 = 0;
  do {
    if (iVar12 == (pIVar6->Columns).Capacity) {
      if (iVar12 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar12 / 2 + iVar12;
      }
      iVar11 = iVar12 + 1;
      if (iVar12 + 1 < iVar5) {
        iVar11 = iVar5;
      }
      pIVar8 = (ImGuiColumnData *)MemAlloc((long)iVar11 * 0x1c);
      pIVar7 = (pIVar6->Columns).Data;
      if (pIVar7 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar8,pIVar7,(long)(pIVar6->Columns).Size * 0x1c);
        MemFree((pIVar6->Columns).Data);
      }
      (pIVar6->Columns).Data = pIVar8;
      (pIVar6->Columns).Capacity = iVar11;
      iVar12 = (pIVar6->Columns).Size;
    }
    else {
      pIVar8 = (pIVar6->Columns).Data;
    }
    pIVar8[iVar12].OffsetNorm = (float)(int)uVar14 / (float)columns_count;
    pIVar8[iVar12].OffsetNormBeforeResize = 0.0;
    pIVar8[iVar12].Flags = 0;
    pIVar1 = &pIVar8[iVar12].ClipRect;
    (pIVar1->Min).x = 3.4028235e+38;
    (pIVar1->Min).y = 3.4028235e+38;
    (pIVar1->Max).x = -3.4028235e+38;
    (pIVar1->Max).y = -3.4028235e+38;
    iVar12 = (pIVar6->Columns).Size + 1;
    (pIVar6->Columns).Size = iVar12;
    uVar14 = uVar14 + 1;
  } while (uVar9 != uVar14);
LAB_002f0c43:
  lVar10 = 0xc;
  uVar13 = 0;
  do {
    if ((long)(pIVar6->Columns).Size <= (long)uVar13) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                    ,0x4de,"T &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
    }
    pIVar8 = (pIVar6->Columns).Data;
    fVar15 = (window->Pos).x;
    fVar16 = GetColumnOffset((int)uVar13);
    fVar16 = (float)(int)(fVar16 + fVar15 + 0.5);
    fVar15 = (window->Pos).x;
    uVar13 = uVar13 + 1;
    fVar20 = GetColumnOffset((int)uVar13);
    fVar15 = (float)(int)(fVar20 + fVar15 + 0.5 + -1.0);
    *(float *)((long)&pIVar8->OffsetNorm + lVar10) = fVar16;
    *(undefined4 *)((long)&pIVar8->OffsetNormBeforeResize + lVar10) = 0xff7fffff;
    *(float *)((long)&pIVar8->Flags + lVar10) = fVar15;
    *(undefined4 *)((long)&(pIVar8->ClipRect).Min.x + lVar10) = 0x7f7fffff;
    IVar3 = (window->ClipRect).Min;
    fVar20 = IVar3.x;
    fVar17 = IVar3.y;
    uVar14 = -(uint)(fVar20 <= fVar16);
    uVar9 = -(uint)(fVar17 <= -3.4028235e+38);
    *(ulong *)((long)&pIVar8->OffsetNorm + lVar10) =
         CONCAT44(~uVar9 & (uint)fVar17,~uVar14 & (uint)fVar20) |
         CONCAT44(uVar9,(uint)fVar16 & uVar14) & 0xff7fffffffffffff;
    auVar19._8_8_ = 0;
    auVar19._0_4_ = (window->ClipRect).Max.x;
    auVar19._4_4_ = (window->ClipRect).Max.y;
    auVar18._4_4_ = 0x7f7fffff;
    auVar18._0_4_ = fVar15;
    auVar18._8_8_ = 0;
    auVar19 = minps(auVar18,auVar19);
    *(long *)((long)&pIVar8->Flags + lVar10) = auVar19._0_8_;
    lVar10 = lVar10 + 0x1c;
  } while ((uint)columns_count != uVar13);
  if (1 < pIVar6->Count) {
    ImDrawListSplitter::Split(&window->DrawList->_Splitter,window->DrawList,pIVar6->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&window->DrawList->_Splitter,window->DrawList,1);
    PushColumnClipRect(0);
  }
  fVar15 = GetColumnOffset(pIVar6->Current);
  fVar16 = GetColumnOffset(pIVar6->Current + 1);
  PushItemWidth((fVar16 - fVar15) * 0.65);
  fVar20 = fVar2 - (window->WindowPadding).x;
  fVar20 = (float)(-(uint)(0.0 <= fVar20) & (uint)fVar20);
  (window->DC).ColumnsOffset.x = fVar20;
  fVar15 = (window->Pos).x;
  (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar15 + fVar20);
  (window->WorkRect).Max.x = (fVar16 + fVar15) - fVar2;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL); // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostClipRect = window->ClipRect;
    columns->HostWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n));
        float clip_x2 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        window->DrawList->ChannelsSplit(1 + columns->Count);
        window->DrawList->ChannelsSetCurrent(1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}